

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# applications_pool.h
# Opt level: O1

shared_ptr<cppcms::application_specific_pool> cppcms::create_pool<json_service>(void)

{
  simple_application_specific_pool1<json_service,_std::_Bind<json_service_*(*(std::_Placeholder<1>))(cppcms::service_&)>_>
  *__p;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __shared_ptr<cppcms::application_specific_pool,(__gnu_cxx::_Lock_policy)2> *in_RDI;
  shared_ptr<cppcms::application_specific_pool> sVar1;
  
  __p = (simple_application_specific_pool1<json_service,_std::_Bind<json_service_*(*(std::_Placeholder<1>))(cppcms::service_&)>_>
         *)operator_new(0x30);
  cppcms::application_specific_pool::application_specific_pool((application_specific_pool *)__p);
  *(undefined ***)__p = &PTR__application_specific_pool_00115be8;
  (__p->call_)._M_f = details::create_app<json_service>;
  *(simple_application_specific_pool1<json_service,_std::_Bind<json_service_*(*(std::_Placeholder<1>))(cppcms::service_&)>_>
    **)in_RDI = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<cppcms::details::simple_application_specific_pool1<json_service,std::_Bind<json_service*(*(std::_Placeholder<1>))(cppcms::service&)>>*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(in_RDI + 8),__p);
  std::__shared_ptr<cppcms::application_specific_pool,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<cppcms::details::simple_application_specific_pool1<json_service,std::_Bind<json_service*(*(std::_Placeholder<1>))(cppcms::service&)>>,cppcms::details::simple_application_specific_pool1<json_service,std::_Bind<json_service*(*(std::_Placeholder<1>))(cppcms::service&)>>>
            (in_RDI,__p);
  sVar1.super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_RDI;
  return (shared_ptr<cppcms::application_specific_pool>)
         sVar1.super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

booster::shared_ptr<application_specific_pool> create_pool(P...p)
	{
        auto functor = std::bind(&details::create_app<T,P...>,std::placeholders::_1,p...);
        typedef details::simple_application_specific_pool1<T,decltype(functor)> pool_type;
		booster::shared_ptr<application_specific_pool> f(new pool_type(std::move(functor)));
		return f;
	}